

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint *input;
  long lVar1;
  uchar *puVar2;
  uint *puVar3;
  uint *output;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  etdc_table *table;
  etdc_table *local_40;
  uchar *local_38;
  
  local_40 = (etdc_table *)0x0;
  input = (uint *)malloc(40000000);
  uVar5 = 0;
  uVar6 = 1;
  uVar7 = 2;
  uVar8 = 3;
  lVar1 = 0;
  do {
    puVar3 = input + lVar1;
    *puVar3 = uVar5;
    puVar3[1] = uVar6;
    puVar3[2] = uVar7;
    puVar3[3] = uVar8;
    lVar1 = lVar1 + 4;
    uVar5 = uVar5 + 4;
    uVar6 = uVar6 + 4;
    uVar7 = uVar7 + 4;
    uVar8 = uVar8 + 4;
  } while (lVar1 != 10000000);
  puVar2 = (uchar *)malloc(40000000);
  uVar5 = firstpass(&local_40,input,10000000);
  printf("Table: ");
  etdc_print(local_40);
  local_38 = puVar2;
  uVar6 = etdc_encode(&local_40,input,10000000,puVar2);
  puVar3 = (uint *)malloc((ulong)uVar5 * 4);
  etdc_voc2uint(local_40,puVar3);
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      printf("voc[%u] = %u\n",uVar4 & 0xffffffff,(ulong)puVar3[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  etdc_free(&local_40);
  output = (uint *)malloc(40000000);
  puVar2 = local_38;
  etdc_decode(puVar3,uVar5,local_38,uVar6,output,10000000);
  lVar1 = 0;
  do {
    if (input[lVar1] != output[lVar1]) {
      printf("waaa %u %u\n");
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10000000);
  free(puVar2);
  puts("END");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  struct etdc_table *table = NULL;
  unsigned char *output;
  unsigned int voc_size;
  int newsize;
  unsigned int *voctable;

  unsigned int *items;
  unsigned int size;
  unsigned int i;

  unsigned int *decoded;

  size = 10000000;
  items = (unsigned int *)malloc(sizeof(unsigned int)*size);
  for(i=0; i < size; i++) items[i]=i;

  
  output = (unsigned char*)malloc(sizeof(unsigned int)*size);
  voc_size = firstpass(&table, items, size);
  printf("Table: "); etdc_print(table);


  newsize = etdc_encode(&table, items, size, output);

  voctable = (unsigned int*) malloc(sizeof(unsigned int)*voc_size);
  etdc_voc2uint(table,voctable);
  for (i=0; i<voc_size;i++) printf("voc[%u] = %u\n", i, voctable[i]);
  
  etdc_free(&table);

  decoded = (unsigned int*)malloc(sizeof(unsigned int)*size);
  etdc_decode(voctable, voc_size, output, newsize, decoded, size);

  for(i=0; i<size; i++) {
    if(items[i] != decoded[i]) {
      printf("waaa %u %u\n", items[i], decoded[i]);
    }

  }

  free(output);

  printf("END\n");
  return 0;
}